

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall CompilerContext::compile_switch(CompilerContext *this,SyntaxTree *switch_node)

{
  element_type *peVar1;
  long lVar2;
  undefined8 swnode;
  undefined8 this_00;
  int iVar3;
  SwitchAnnotation *pSVar4;
  SwitchCaseAnnotation *__args_1;
  element_type *peVar5;
  Command *pCVar6;
  Command *pCVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  size_t i;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  element_type *peVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar13;
  optional<const_Command_&> opt_switch_start;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> cases;
  shared_ptr<Label> break_ptr;
  optional<const_Command_&> opt_switch_continued;
  optional<const_Command_&> local_b0;
  LoopInfo local_a8;
  undefined1 local_80 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  make_internal_label((CompilerContext *)local_80);
  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8.break_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)local_80);
  local_80._24_8_ = &this->loop_stack;
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::
  emplace_back<CompilerContext::LoopInfo>(&this->loop_stack,&local_a8);
  local_80._32_8_ = this;
  LoopInfo::~LoopInfo(&local_a8);
  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8.break_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pSVar4 = linb::any_cast<SwitchAnnotation_const&>(&switch_node->udata);
  std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::reserve
            ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&local_a8,
             pSVar4->num_cases + 1);
  peVar1 = (switch_node->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar13 = 0;
  local_80._16_8_ = switch_node;
  for (p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0; this_00 = local_80._32_8_,
      swnode = local_80._16_8_,
      lVar2 = *(long *)&(peVar1->childs).
                        super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
      , peVar5 = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,
      _Var8._M_pi = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,
      _Var12._M_pi = local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi,
      p_Var10 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)*(pointer *)((long)&peVar1->childs + 8) - lVar2 >> 4);
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var10->_vptr__Sp_counted_base + 1)) {
    lVar2 = *(long *)(lVar2 + lVar13);
    if (*(int *)(lVar2 + 0x10) == 0x1e) {
      iVar3 = linb::any_cast<int>((any *)(**(long **)(lVar2 + 0x40) + 0x70));
      local_b0.ref._0_4_ = iVar3;
      __args_1 = linb::any_cast<SwitchCaseAnnotation_const&>((any *)(lVar2 + 0x70));
      std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>::
      emplace_back<int&,Command_const*const&>
                ((vector<CompilerContext::Case,std::allocator<CompilerContext::Case>> *)&local_a8,
                 (int *)&local_b0,&__args_1->is_var_eq_int);
    }
    else if (*(int *)(lVar2 + 0x10) == 0x1f) {
      std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>::
      emplace_back<std::experimental::nullopt_t_const&,std::experimental::nullopt_t_const&>
                ((vector<CompilerContext::Case,std::allocator<CompilerContext::Case>> *)&local_a8,
                 (nullopt_t *)&nullopt,(nullopt_t *)&nullopt);
    }
    else if (local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)
             local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[-1]._vptr__Sp_counted_base ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
        local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[-1]._vptr__Sp_counted_base = (_func_int **)p_Var10;
      }
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       &local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[-1]._M_use_count = p_Var10;
    }
    lVar13 = lVar13 + 0x10;
  }
  for (; peVar5 != (element_type *)
                   local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi; peVar5 = peVar5 + 1) {
    p_Var10 = (peVar5->where).super___weak_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
      _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar5 + 1);
      if (_Var12._M_pi ==
          local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi) {
        _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
      }
    }
    else {
      _Var9._M_pi = _Var8._M_pi;
      peVar11 = (element_type *)_Var12._M_pi;
      if (_Var12._M_pi !=
          local_a8.continue_label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi) {
        for (; _Var9._M_pi = local_a8.continue_label.
                             super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            , _Var12._M_pi = local_a8.continue_label.
                             super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            , peVar11 != (element_type *)_Var8._M_pi; peVar11 = peVar11 + 1) {
          (peVar11->where).super___weak_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var10;
          (peVar11->code_position).super_OptionalBase<unsigned_int> =
               (peVar5->code_position).super_OptionalBase<unsigned_int>;
        }
      }
    }
    _Var8._M_pi = _Var9._M_pi;
  }
  local_b0.ref = ((*(Commands **)(local_80._32_8_ + 0x58))->switch_start).ref;
  pCVar7 = ((*(Commands **)(local_80._32_8_ + 0x58))->switch_continued).ref;
  local_80._40_8_ = pCVar7;
  if (((local_b0.ref == (Command *)0x0) ||
      (pCVar6 = std::experimental::optional<const_Command_&>::operator->(&local_b0),
      (pCVar7 != (Command *)0x0 & pCVar6->supported) != 1)) ||
     (pCVar7 = std::experimental::optional<const_Command_&>::operator->
                         ((optional<const_Command_&> *)(local_80 + 0x28)), pCVar7->supported != true
     )) {
    std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x30),
               (__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)local_80);
    compile_switch_ifchain
              ((CompilerContext *)this_00,(SyntaxTree *)swnode,
               (vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&local_a8,
               (shared_ptr<Label> *)(local_80 + 0x30));
    this_01 = &local_48;
  }
  else {
    std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *)local_80);
    compile_switch_withop
              ((CompilerContext *)this_00,(SyntaxTree *)swnode,
               (vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&local_a8,
               (shared_ptr<Label> *)&local_40);
    this_01 = &local_40._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::pop_back
            ((vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_> *)
             local_80._24_8_);
  std::vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>::~vector
            ((vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *)&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  return;
}

Assistant:

void CompilerContext::compile_switch(const SyntaxTree& switch_node)
{
    auto continue_ptr = nullptr;
    auto break_ptr = make_internal_label();

    loop_stack.emplace_back(LoopInfo{ continue_ptr, break_ptr });

    std::vector<Case> cases;
    cases.reserve(1 + switch_node.annotation<const SwitchAnnotation&>().num_cases);

    auto& switch_body = switch_node.child(1);
    for(size_t i = 0; i < switch_body.child_count(); ++i)
    {
        auto& node = switch_body.child(i);
        switch(node.type())
        {
            case NodeType::CASE:
            {
                auto value  = node.child(0).annotation<int32_t>();
                auto& isveq = node.annotation<const SwitchCaseAnnotation&>().is_var_eq_int;
                cases.emplace_back(value, isveq);
                break;
            }

            case NodeType::DEFAULT:
            {
                cases.emplace_back(nullopt, nullopt);
                break;
            }

            default: // statement
            {
                if(!cases.empty())
                {
                    auto& prev_case = cases.back();
                    if(prev_case.first_statement_id == SIZE_MAX)
                        prev_case.first_statement_id = i;
                    prev_case.last_statement_id = i;
                }
                break;
            }
        }
    }

    auto blank_cases_begin = cases.end();
    auto blank_cases_end   = cases.end();

    for(auto it = cases.begin(); it != cases.end(); ++it)
    {
        if(it->is_empty())
        {
            if(blank_cases_begin == cases.end())
            {
                blank_cases_begin = it;
                blank_cases_end   = std::next(it);
            }
            else
            {
                blank_cases_end = std::next(it);
            }
        }
        else
        {
            if(blank_cases_begin != cases.end())
            {
                for(auto e = blank_cases_begin; e != blank_cases_end; ++e)
                {
                    e->first_statement_id = it->first_statement_id;
                    e->last_statement_id  = it->last_statement_id;
                }

                blank_cases_begin = cases.end();
                blank_cases_end = cases.end();
            }
        }
    }

    auto opt_switch_start = commands.switch_start;
    auto opt_switch_continued = commands.switch_continued;

    if(opt_switch_start && opt_switch_start->supported
    && opt_switch_continued && opt_switch_continued->supported)
    {
        compile_switch_withop(switch_node, cases, break_ptr);
    }
    else
    {
        compile_switch_ifchain(switch_node, cases, break_ptr);
    }

    loop_stack.pop_back();
}